

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLevelQ.c
# Opt level: O1

DdLevelQueue * cuddLevelQueueInit(int levels,int itemSize,int numBuckets)

{
  int iVar1;
  int iVar2;
  DdLevelQueue *__ptr;
  DdQueueItem **__ptr_00;
  DdQueueItem **__s;
  size_t __size;
  uint value;
  
  __ptr = (DdLevelQueue *)malloc(0x38);
  if (__ptr != (DdLevelQueue *)0x0) {
    __ptr_00 = (DdQueueItem **)malloc((long)levels << 3);
    __ptr->last = __ptr_00;
    if (__ptr_00 != (DdQueueItem **)0x0) {
      value = 2;
      if (2 < numBuckets) {
        value = numBuckets;
      }
      iVar1 = cuddComputeFloorLog2(value);
      iVar2 = 1 << ((byte)iVar1 & 0x1f);
      __ptr->numBuckets = iVar2;
      __ptr->shift = 0x20 - iVar1;
      __size = (long)iVar2 << 3;
      __s = (DdQueueItem **)malloc(__size);
      __ptr->buckets = __s;
      if (__s != (DdQueueItem **)0x0) {
        memset(__ptr_00,0,(long)levels << 3);
        memset(__s,0,__size);
        __ptr->first = (void *)0x0;
        __ptr->freelist = (DdQueueItem *)0x0;
        __ptr->levels = levels;
        __ptr->itemsize = itemSize;
        __ptr->size = 0;
        __ptr->maxsize = 4 << ((byte)iVar1 & 0x1f);
        return __ptr;
      }
      free(__ptr_00);
      __ptr->last = (DdQueueItem **)0x0;
    }
    free(__ptr);
  }
  return (DdLevelQueue *)0x0;
}

Assistant:

DdLevelQueue *
cuddLevelQueueInit(
  int  levels /* number of levels */,
  int  itemSize /* size of the item */,
  int  numBuckets /* initial number of hash buckets */)
{
    DdLevelQueue *queue;
    int logSize;

    queue = ABC_ALLOC(DdLevelQueue,1);
    if (queue == NULL)
        return(NULL);
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    /* Keep pointers to the insertion points for all levels. */
    queue->last = ABC_ALLOC(DdQueueItem *, levels);
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (queue->last == NULL) {
        ABC_FREE(queue);
        return(NULL);
    }
    /* Use a hash table to test for uniqueness. */
    if (numBuckets < 2) numBuckets = 2;
    logSize = cuddComputeFloorLog2(numBuckets);
    queue->numBuckets = 1 << logSize;
    queue->shift = sizeof(int) * 8 - logSize;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    queue->buckets = ABC_ALLOC(DdQueueItem *, queue->numBuckets);
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (queue->buckets == NULL) {
        ABC_FREE(queue->last);
        ABC_FREE(queue);
        return(NULL);
    }
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    memset(queue->last, 0, levels * sizeof(DdQueueItem *));
    memset(queue->buckets, 0, queue->numBuckets * sizeof(DdQueueItem *));
#ifdef __osf__
#pragma pointer_size restore
#endif
    queue->first = NULL;
    queue->freelist = NULL;
    queue->levels = levels;
    queue->itemsize = itemSize;
    queue->size = 0;
    queue->maxsize = queue->numBuckets * DD_MAX_SUBTABLE_DENSITY;
    return(queue);

}